

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jedi_baseline_index_impl.h
# Opt level: O2

void __thiscall
json::JEDIBaselineTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>::
step_three(JEDIBaselineTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>
           *this,vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *mask_matrix,unsigned_long *matrix_size,
          vector<double,_std::allocator<double>_> *col_cover,int *step)

{
  unsigned_long uVar1;
  pointer pvVar2;
  long lVar3;
  pointer pdVar4;
  unsigned_long uVar5;
  unsigned_long c;
  unsigned_long uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  double dVar9;
  
  uVar1 = *matrix_size;
  pvVar2 = (mask_matrix->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  for (uVar5 = 0; uVar5 != uVar1; uVar5 = uVar5 + 1) {
    lVar3 = *(long *)&pvVar2[uVar5].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data;
    pdVar4 = (col_cover->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
      dVar9 = *(double *)(lVar3 + uVar6 * 8);
      if ((dVar9 == 1.0) && (!NAN(dVar9))) {
        pdVar4[uVar6] = 1.0;
      }
    }
  }
  dVar9 = 0.0;
  for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
    uVar7 = -(ulong)((col_cover->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar5] == 1.0);
    dVar9 = (double)(~uVar7 & (ulong)dVar9 | (ulong)(dVar9 + 1.0) & uVar7);
  }
  auVar8._8_4_ = (int)(uVar1 >> 0x20);
  auVar8._0_8_ = uVar1;
  auVar8._12_4_ = 0x45300000;
  *step = (uint)((auVar8._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0) <= dVar9) * 3 + 4;
  return;
}

Assistant:

void JEDIBaselineTreeIndex<cost_matrixModel, TreeIndex>::step_three(
    std::vector<std::vector<double> >& mask_matrix,
    unsigned long& matrix_size,
    std::vector<double>& col_cover,
    int& step)
{
  double col_count = 0;
  for (unsigned long r = 0; r < matrix_size; r++)
  {
    for (unsigned long c = 0; c < matrix_size; c++)
    {
      if (mask_matrix[r][c] == 1)
      {
        col_cover[c] = 1;
      }
    }
  }

  col_count = 0;
  for (unsigned long c = 0; c < matrix_size; c++)
  {
    if (col_cover[c] == 1)
    {
        col_count += 1;
    }
  }
  if (col_count >= matrix_size)
  {
    step = 7;
  }
  else
  {
    step = 4;
  }
}